

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>
                   (string *__return_storage_ptr__,char (*a) [8],long *b,char (*args) [17],
                   unsigned_long *args_1,char (*args_2) [3],unsigned_long *args_3,char (*args_4) [2]
                   )

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_278;
  cmAlphaNum local_240;
  cmAlphaNum local_208;
  cmAlphaNum local_1d0;
  cmAlphaNum local_198;
  cmAlphaNum local_160;
  cmAlphaNum local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [3];
  char (*args_local_2) [3];
  unsigned_long *args_local_1;
  char (*args_local) [17];
  long *b_local;
  char (*a_local) [8];
  
  local_38 = args_2;
  args_local_2 = (char (*) [3])args_1;
  args_local_1 = (unsigned_long *)args;
  args_local = (char (*) [17])b;
  b_local = (long *)a;
  a_local = (char (*) [8])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_128,*a);
  cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const(&)[8],long&,char_const(&)[17],unsigned_long&&,char_const(&)[3],unsigned_long&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_f0,
             &cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const&[],long&,char_const&[],unsigned_long&&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_128);
  cmAlphaNum::cmAlphaNum(&local_160,*(long *)*args_local);
  cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const(&)[8],long&,char_const(&)[17],unsigned_long&&,char_const(&)[3],unsigned_long&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const&[],long&,char_const&[],unsigned_long&&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_160);
  cmAlphaNum::cmAlphaNum(&local_198,(char *)args_local_1);
  cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const(&)[8],long&,char_const(&)[17],unsigned_long&&,char_const(&)[3],unsigned_long&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const&[],long&,char_const&[],unsigned_long&&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_198);
  cmAlphaNum::cmAlphaNum(&local_1d0,*(unsigned_long *)args_local_2);
  cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const(&)[8],long&,char_const(&)[17],unsigned_long&&,char_const(&)[3],unsigned_long&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const&[],long&,char_const&[],unsigned_long&&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_1d0);
  cmAlphaNum::cmAlphaNum(&local_208,*local_38);
  cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const(&)[8],long&,char_const(&)[17],unsigned_long&&,char_const(&)[3],unsigned_long&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const&[],long&,char_const&[],unsigned_long&&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_208);
  cmAlphaNum::cmAlphaNum(&local_240,*args_3);
  cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const(&)[8],long&,char_const(&)[17],unsigned_long&&,char_const(&)[3],unsigned_long&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const&[],long&,char_const&[],unsigned_long&&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_240);
  cmAlphaNum::cmAlphaNum(&local_278,*args_4);
  cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const(&)[8],long&,char_const(&)[17],unsigned_long&&,char_const(&)[3],unsigned_long&&,char_const(&)[2])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[8],long&,char_const(&)[17],unsigned_long,char_const(&)[3],unsigned_long,char_const(&)[2]>(char_const&[],long&,char_const&[],unsigned_long&&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_278);
  local_48 = &local_f0;
  local_40 = 7;
  views._M_len = 7;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}